

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  u32 uVar3;
  Pgno PVar4;
  uint uVar5;
  BtShared *pBt;
  Wal *pWVar6;
  MemPage *pMVar7;
  Pager *pPVar8;
  uint uVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  BtLock *pBVar15;
  u16 uVar16;
  Btree *pBVar17;
  uint uVar18;
  u8 *puVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  MemPage *pPage1;
  int local_4c;
  uint *local_48;
  u32 *local_40;
  MemPage *local_38;
  
  pBt = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  uVar12 = 0;
  if ((p->inTrans == '\x02') || (uVar12 = 0, wrflag == 0 && p->inTrans == '\x01'))
  goto LAB_001210bb;
  if (((p->db->flags & 0x2000000) != 0) && (pBt->pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && (uVar12 = 8, (pBt->btsFlags & 1) != 0)) goto LAB_001210bb;
  cVar10 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar10 < '\0') goto LAB_00120aea;
LAB_00120ac8:
    bVar21 = true;
    if (1 < wrflag) {
      for (pBVar15 = pBt->pLock; pBVar15 != (BtLock *)0x0; pBVar15 = pBVar15->pNext) {
        pBVar17 = pBVar15->pBtree;
        if (pBVar17 != p) goto LAB_00120aee;
      }
    }
  }
  else {
    if ((-1 < cVar10) && (pBt->inTransaction != '\x02')) goto LAB_00120ac8;
LAB_00120aea:
    pBVar17 = pBt->pWriter;
LAB_00120aee:
    bVar21 = pBVar17->db == (sqlite3 *)0x0;
  }
  uVar12 = 0x106;
  if ((bVar21) &&
     (local_48 = (uint *)pSchemaVersion, uVar12 = querySharedCacheTableLock(p,1,'\x01'),
     pSchemaVersion = (int *)local_48, uVar12 == 0)) {
    uVar2 = pBt->btsFlags;
    pBt->btsFlags = uVar2 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt->pageSize;
    uVar12 = 0;
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        do {
          uVar13 = sqlite3PagerSharedLock(pBt->pPager);
          if ((uVar13 == 0) &&
             (uVar13 = btreeGetPage(pBt,1,&local_38,0), pMVar7 = local_38, uVar13 == 0)) {
            puVar19 = local_38->aData;
            uVar13 = *(uint *)(puVar19 + 0x1c);
            uVar20 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                     uVar13 << 0x18;
            uVar5 = pBt->pPager->dbSize;
            if ((uVar20 == 0) || (*(int *)(puVar19 + 0x18) != *(int *)(puVar19 + 0x5c))) {
              uVar20 = uVar5;
            }
            if ((pBt->db->flags & 0x2000000) != 0) {
              uVar20 = 0;
            }
            if (uVar20 == 0) {
LAB_00120bf2:
              uVar3 = pBt->usableSize;
              uVar12 = (uVar3 * 0x40 - 0x300) / 0xff - 0x17;
              pBt->maxLocal = (u16)uVar12;
              uVar16 = (short)((uVar3 * 0x20 - 0x180) / 0xff) - 0x17;
              pBt->minLocal = uVar16;
              pBt->maxLeaf = (short)uVar3 - 0x23;
              pBt->minLeaf = uVar16;
              if ((uVar12 & 0xffff) < 0x80) {
                pBt->max1bytePayload = (u8)uVar12;
              }
              else {
                pBt->max1bytePayload = '\x7f';
              }
              pBt->pPage1 = pMVar7;
              pBt->nPage = uVar20;
              uVar13 = 0;
            }
            else {
              auVar22[0] = -(*puVar19 == 'S');
              auVar22[1] = -(puVar19[1] == 'Q');
              auVar22[2] = -(puVar19[2] == 'L');
              auVar22[3] = -(puVar19[3] == 'i');
              auVar22[4] = -(puVar19[4] == 't');
              auVar22[5] = -(puVar19[5] == 'e');
              auVar22[6] = -(puVar19[6] == ' ');
              auVar22[7] = -(puVar19[7] == 'f');
              auVar22[8] = -(puVar19[8] == 'o');
              auVar22[9] = -(puVar19[9] == 'r');
              auVar22[10] = -(puVar19[10] == 'm');
              auVar22[0xb] = -(puVar19[0xb] == 'a');
              auVar22[0xc] = -(puVar19[0xc] == 't');
              auVar22[0xd] = -(puVar19[0xd] == ' ');
              auVar22[0xe] = -(puVar19[0xe] == '3');
              auVar22[0xf] = -(puVar19[0xf] == '\0');
              uVar13 = 0x1a;
              if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
                if (2 < puVar19[0x12]) {
                  *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
                }
                if (2 < puVar19[0x13]) goto LAB_00120be0;
                if ((puVar19[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                  local_4c = 0;
                  uVar13 = sqlite3PagerOpenWal(pBt->pPager,&local_4c);
                  uVar12 = 0;
                  if (uVar13 == 0) {
                    if (local_4c == 0) {
                      releasePageOne(pMVar7);
                      bVar21 = false;
                      iVar14 = 1;
                      uVar13 = 0;
                    }
                    else {
                      uVar13 = 0x1a;
                      iVar14 = 0;
                      bVar21 = true;
                    }
                  }
                  else {
                    iVar14 = 2;
                    bVar21 = false;
                  }
                  if (bVar21) goto LAB_00120cef;
                  goto LAB_00120be5;
                }
LAB_00120cef:
                if (puVar19[0x17] == ' ' && *(short *)(puVar19 + 0x15) == 0x2040) {
                  uVar9 = (uint)puVar19[0x10] * 0x100;
                  uVar12 = (uint)puVar19[0x11] * 0x10000;
                  if (((uVar12 + uVar9) - 0x10001 < 0xffff0100) ||
                     (uVar18 = uVar12 | uVar9, ((uVar12 + uVar9) - 1 & uVar18) != 0))
                  goto LAB_00120d0a;
                  *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                  bVar11 = puVar19[0x14];
                  uVar12 = uVar18 - bVar11;
                  if (uVar18 == pBt->pageSize) {
                    if (((pBt->db->flags & 0x10000001) == 1) || (uVar20 <= uVar5)) {
                      if (0x1df < uVar12) {
                        pBt->pageSize = uVar18;
                        pBt->usableSize = uVar12;
                        uVar12 = *(uint *)(puVar19 + 0x34);
                        pBt->autoVacuum =
                             ((uVar12 >> 0x18 != 0 || (uVar12 & 0xff0000) != 0) ||
                             (uVar12 & 0xff00) != 0) || (uVar12 & 0xff) != 0;
                        uVar12 = *(uint *)(puVar19 + 0x40);
                        pBt->incrVacuum =
                             ((uVar12 >> 0x18 != 0 || (uVar12 & 0xff0000) != 0) ||
                             (uVar12 & 0xff00) != 0) || (uVar12 & 0xff) != 0;
                        iVar14 = 0;
                        uVar12 = 0;
                        goto LAB_00120be5;
                      }
                    }
                    else {
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1033d,
                                  "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50"
                                 );
                      uVar13 = 0xb;
                    }
                    goto LAB_00120d0a;
                  }
                  releasePageOne(pMVar7);
                  pBt->usableSize = uVar12;
                  pBt->pageSize = uVar18;
                  if (pBt->pTmpSpace != (u8 *)0x0) {
                    puVar19 = pBt->pTmpSpace + -4;
                    pBt->pTmpSpace = puVar19;
                    pcache1Free(puVar19);
                    pBt->pTmpSpace = (u8 *)0x0;
                  }
                  uVar12 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar11);
                  iVar14 = 1;
                  uVar13 = uVar12;
                }
                else {
LAB_00120d0a:
                  uVar12 = 0;
                  iVar14 = 2;
                }
              }
              else {
LAB_00120be0:
                iVar14 = 2;
                uVar13 = 0x1a;
              }
LAB_00120be5:
              if (iVar14 == 2) {
                releasePageOne(pMVar7);
                pBt->pPage1 = (MemPage *)0x0;
              }
              else {
                uVar13 = uVar12;
                if (iVar14 == 0) goto LAB_00120bf2;
              }
            }
          }
          uVar12 = uVar13;
          if (uVar12 != 0) goto LAB_00120e89;
        } while (pBt->pPage1 == (MemPage *)0x0);
        uVar12 = 0;
      }
LAB_00120e89:
      if (((wrflag != 0) && (uVar12 == 0)) && (uVar12 = 8, (pBt->btsFlags & 1) == 0)) {
        pPVar8 = pBt->pPager;
        uVar12 = pPVar8->errCode;
        if (uVar12 == 0) {
          pPVar8->subjInMemory = p->db->temp_store == '\x02';
          uVar12 = 0;
          if (pPVar8->eState == '\x01') {
            if (pPVar8->pWal == (Wal *)0x0) {
              uVar12 = pagerLockDb(pPVar8,2);
              if (uVar12 == 0 && 1 < wrflag) {
                do {
                  uVar12 = pagerLockDb(pPVar8,4);
                  if (uVar12 != 5) break;
                  iVar14 = (*pPVar8->xBusyHandler)(pPVar8->pBusyHandlerArg);
                } while (iVar14 != 0);
              }
            }
            else {
              if ((pPVar8->exclusiveMode != '\0') && (pPVar8->pWal->exclusiveMode == '\0')) {
                uVar12 = pagerLockDb(pPVar8,4);
                if (uVar12 != 0) goto LAB_00121043;
                pWVar6 = pPVar8->pWal;
                if (pWVar6->exclusiveMode == '\0') {
                  (*pWVar6->pDbFd->pMethods->xShmLock)(pWVar6->pDbFd,pWVar6->readLock + 3,1,5);
                }
                pWVar6->exclusiveMode = '\x01';
              }
              pWVar6 = pPVar8->pWal;
              uVar12 = 8;
              if (pWVar6->readOnly == '\0') {
                uVar12 = 0;
                if (pWVar6->exclusiveMode == '\0') {
                  uVar12 = (*pWVar6->pDbFd->pMethods->xShmLock)(pWVar6->pDbFd,0,1,10);
                }
                if (uVar12 == 0) {
                  pWVar6->writeLock = '\x01';
                  iVar14 = bcmp(&pWVar6->hdr,*pWVar6->apWiData,0x30);
                  if (iVar14 == 0) {
                    uVar12 = 0;
                  }
                  else {
                    if (pWVar6->exclusiveMode == '\0') {
                      (*pWVar6->pDbFd->pMethods->xShmLock)(pWVar6->pDbFd,0,1,9);
                    }
                    pWVar6->writeLock = '\0';
                    uVar12 = 0x205;
                  }
                }
              }
            }
            if (uVar12 == 0) {
              pPVar8->eState = '\x02';
              PVar4 = pPVar8->dbSize;
              pPVar8->dbHintSize = PVar4;
              pPVar8->dbFileSize = PVar4;
              pPVar8->dbOrigSize = PVar4;
              pPVar8->journalOff = 0;
              uVar12 = 0;
            }
          }
        }
LAB_00121043:
        if (uVar12 == 0x205) {
          uVar12 = (uint)(pBt->inTransaction != '\0') << 9 | 5;
        }
        else if (uVar12 == 0) {
          uVar12 = newDatabase(pBt);
        }
      }
      if (((uVar12 != 0) && (pBt->inTransaction == '\0')) &&
         (pMVar7 = pBt->pPage1, pMVar7 != (MemPage *)0x0)) {
        pBt->pPage1 = (MemPage *)0x0;
        releasePageOne(pMVar7);
      }
    } while ((((char)uVar12 == '\x05') && (pBt->inTransaction == '\0')) &&
            (iVar14 = btreeInvokeBusyHandler(pBt), iVar14 != 0));
    pSchemaVersion = (int *)local_48;
    if (uVar12 == 0) {
      if ((p->inTrans == '\0') && (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0'))
      {
        (p->lock).eLock = '\x01';
        (p->lock).pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
      bVar11 = 2 - (wrflag == 0);
      p->inTrans = bVar11;
      if (pBt->inTransaction < bVar11) {
        pBt->inTransaction = bVar11;
      }
      uVar13 = 0;
      uVar12 = uVar13;
      if (wrflag != 0) {
        pMVar7 = pBt->pPage1;
        pBt->pWriter = p;
        pBt->btsFlags = (ushort)(1 < wrflag) << 6 | pBt->btsFlags & 0xffbf;
        uVar5 = *(uint *)(pMVar7->aData + 0x1c);
        if ((pBt->nPage !=
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)) &&
           (uVar12 = sqlite3PagerWrite(pMVar7->pDbPage), pSchemaVersion = (int *)local_48,
           uVar12 == 0)) {
          uVar12 = pBt->nPage;
          *(uint *)(pMVar7->aData + 0x1c) =
               uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
          uVar12 = uVar13;
        }
      }
    }
  }
LAB_001210bb:
  if (uVar12 == 0) {
    if ((uint *)pSchemaVersion != (uint *)0x0) {
      uVar12 = *(uint *)(pBt->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    }
    uVar12 = 0;
    if (wrflag != 0) {
      pPVar8 = pBt->pPager;
      iVar14 = p->db->nSavepoint;
      if ((pPVar8->nSavepoint < iVar14) && (uVar12 = 0, pPVar8->useJournal != '\0')) {
        uVar12 = pagerOpenSavepoint(pPVar8,iVar14);
      }
    }
  }
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return uVar12;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeBeginTrans(Btree *p, int wrflag, int *pSchemaVersion){
  BtShared *pBt = p->pBt;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase) 
   && sqlite3PagerIsreadonly(pBt->pPager)==0 
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction 
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on 
  ** page 1. So if some other shared-cache client already has a write-lock 
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, MASTER_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database 
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pBt->pPager,wrflag>1,sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }
  
    if( rc!=SQLITE_OK ){
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerResetLockTimeout(pBt->pPager);

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely 
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pBt->pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}